

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAT2FO.cpp
# Opt level: O1

SATClause * __thiscall
SAT::SAT2FO::createConflictClause(SAT2FO *this,LiteralStack *unsatCore,InferenceRule rule)

{
  Literal *pLVar1;
  Clause *cl;
  SATClause *pSVar2;
  Literal **ppLVar3;
  NonspecificInference0 local_62;
  Inference local_60;
  
  if (createConflictClause(Lib::Stack<Kernel::Literal*>&,Kernel::InferenceRule)::negStack == '\0') {
    createConflictClause();
  }
  createConflictClause::negStack._cursor = createConflictClause::negStack._stack;
  ppLVar3 = unsatCore->_cursor;
  if (ppLVar3 != unsatCore->_stack) {
    do {
      pLVar1 = Kernel::Literal::complementaryLiteral(ppLVar3[-1]);
      if (createConflictClause::negStack._cursor == createConflictClause::negStack._end) {
        ::Lib::Stack<Kernel::Literal_*>::expand(&createConflictClause::negStack);
      }
      *createConflictClause::negStack._cursor = pLVar1;
      createConflictClause::negStack._cursor = createConflictClause::negStack._cursor + 1;
      ppLVar3 = ppLVar3 + -1;
    } while (ppLVar3 != unsatCore->_stack);
  }
  local_62.inputType = AXIOM;
  local_62.rule = rule;
  Kernel::Inference::Inference(&local_60,&local_62);
  cl = Kernel::Clause::fromStack(&createConflictClause::negStack,&local_60);
  pSVar2 = toSAT(this,cl);
  return pSVar2;
}

Assistant:

SATClause* SAT2FO::createConflictClause(LiteralStack& unsatCore, InferenceRule rule)
{
  static LiteralStack negStack;
  negStack.reset();
  LiteralStack::ConstIterator ucit(unsatCore);
  while(ucit.hasNext()) {
    Literal* ul = ucit.next();
    negStack.push(Literal::complementaryLiteral(ul));
  }
  Clause* foConfl = Clause::fromStack(negStack,NonspecificInference0(UnitInputType::AXIOM,rule));
  return toSAT(foConfl);
}